

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
ChebTools::ChebyshevExpansion::real_roots_intervals
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
          *segments,bool only_in_domain)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_78;
  const_iterator local_70;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> segroots;
  ChebyshevExpansion *seg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> *__range1;
  bool only_in_domain_local;
  vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
  *segments_local;
  vector<double,_std::allocator<double>_> *roots;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  __end1 = std::
           vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
           begin(segments);
  seg = (ChebyshevExpansion *)
        std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
        end(segments);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_ChebTools::ChebyshevExpansion_*,_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_>
                                     *)&seg), bVar1) {
    segroots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_ChebTools::ChebyshevExpansion_*,_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_>
                  ::operator*(&__end1);
    real_roots((vector<double,_std::allocator<double>_> *)local_58,
               (ChebyshevExpansion *)
               segroots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,only_in_domain);
    local_78._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::end(__return_storage_ptr__);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_70,&local_78);
    __first = std::vector<double,_std::allocator<double>_>::cbegin
                        ((vector<double,_std::allocator<double>_> *)local_58);
    __last = std::vector<double,_std::allocator<double>_>::cend
                       ((vector<double,_std::allocator<double>_> *)local_58);
    std::vector<double,std::allocator<double>>::
    insert<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
              ((vector<double,std::allocator<double>> *)__return_storage_ptr__,local_70,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               __first._M_current,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               __last._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_58);
    __gnu_cxx::
    __normal_iterator<const_ChebTools::ChebyshevExpansion_*,_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots_intervals(const std::vector<ChebyshevExpansion> &segments, bool only_in_domain) {
        std::vector<double> roots;
        for (auto &seg : segments) {
            const auto segroots = seg.real_roots(only_in_domain);
            roots.insert(roots.end(), segroots.cbegin(), segroots.cend());
        }
        return roots;
    }